

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

void __thiscall covenant::CFGConnect::cleanup(CFGConnect *this,EVP_PKEY_CTX *ctx)

{
  std::vector<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>::
  clear(&this->verts);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&this->groups);
  if ((this->S).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      (this->S).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    do {
      std::deque<int,_std::allocator<int>_>::pop_back(&(this->S).c);
    } while ((this->S).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
             ._M_finish._M_cur !=
             (this->S).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
             ._M_start._M_cur);
  }
  return;
}

Assistant:

void cleanup(){
      verts.clear();
      groups.clear();
      while (!S.empty()) { S.pop(); }
    }